

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O2

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  string_view filename_local;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filename_local,'/',0xffffffffffffffff);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&filename_local,'\\',0xffffffffffffffff);
  if ((sVar2 & sVar1) == 0xffffffffffffffff) {
LAB_0011ef39:
    bVar4._M_str = filename_local._M_str;
    bVar4._M_len = filename_local._M_len;
  }
  else {
    if (sVar1 == 0xffffffffffffffff) {
      sVar3 = sVar2;
      if (sVar2 == 0xffffffffffffffff) goto LAB_0011ef39;
    }
    else {
      sVar3 = sVar1;
      if ((sVar2 != 0xffffffffffffffff) && (sVar3 = sVar2, sVar2 < sVar1)) {
        sVar3 = sVar1;
      }
    }
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&filename_local,sVar3 + 1,0xffffffffffffffff);
  }
  sVar5._M_len = bVar4._M_len;
  sVar5._M_str = bVar4._M_str;
  return sVar5;
}

Assistant:

std::string_view GetBasename(std::string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == std::string_view::npos &&
      last_backslash == std::string_view::npos) {
    return filename;
  }

  if (last_slash == std::string_view::npos) {
    if (last_backslash == std::string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != std::string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}